

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::init_progressive(jpeg_decoder *this)

{
  bool bVar1;
  int iVar2;
  coeff_buf *pcVar3;
  jpeg_decoder *in_RDI;
  bool bVar4;
  pDecode_block_func decode_block_func;
  pDecode_block_func in_stack_00000018;
  int refinement_scan;
  int dc_only_scan;
  uint32_t MAX_SCANS_TO_PROCESS;
  uint32_t total_scans;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  jpgd_status in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd8;
  code *this_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint local_10;
  int local_c;
  
  if (in_RDI->m_comps_in_frame == 4) {
    stop_decoding(in_RDI,in_stack_ffffffffffffffcc);
  }
  for (local_c = 0; local_c < in_RDI->m_comps_in_frame; local_c = local_c + 1) {
    pcVar3 = coeff_buf_open((jpeg_decoder *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                            (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                            (int)in_stack_ffffffffffffffd8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI)
    ;
    in_RDI->m_dc_coeffs[local_c] = pcVar3;
    pcVar3 = coeff_buf_open((jpeg_decoder *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                            (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                            (int)in_stack_ffffffffffffffd8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI)
    ;
    in_RDI->m_ac_coeffs[local_c] = pcVar3;
  }
  local_10 = 0;
  while( true ) {
    iVar2 = init_scan((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
    ;
    if (iVar2 == 0) {
      in_RDI->m_comps_in_scan = in_RDI->m_comps_in_frame;
      for (local_c = 0; local_c < in_RDI->m_comps_in_frame; local_c = local_c + 1) {
        in_RDI->m_comp_list[local_c] = local_c;
      }
      bVar1 = calc_mcu_block_order(in_RDI);
      if (bVar1) {
        return;
      }
      stop_decoding(in_RDI,in_stack_ffffffffffffffcc);
    }
    bVar1 = in_RDI->m_spectral_start != 0;
    bVar4 = in_RDI->m_successive_high != 0;
    if ((in_RDI->m_spectral_end < in_RDI->m_spectral_start) || (0x3f < in_RDI->m_spectral_end)) {
      stop_decoding(in_RDI,in_stack_ffffffffffffffcc);
    }
    if (bVar1) {
      if (in_RDI->m_comps_in_scan != 1) {
        stop_decoding(in_RDI,in_stack_ffffffffffffffcc);
      }
    }
    else if (in_RDI->m_spectral_end != 0) {
      stop_decoding(in_RDI,in_stack_ffffffffffffffcc);
    }
    if ((bVar4) && (in_RDI->m_successive_low != in_RDI->m_successive_high + -1)) break;
    if (bVar1) {
      if (bVar4) {
        this_00 = decode_block_ac_refine;
      }
      else {
        this_00 = decode_block_ac_first;
      }
    }
    else if (bVar4) {
      this_00 = decode_block_dc_refine;
    }
    else {
      this_00 = decode_block_dc_first;
    }
    decode_scan(_dc_only_scan,in_stack_00000018);
    in_RDI->m_bits_left = 0x10;
    get_bits((jpeg_decoder *)this_00,(int)((ulong)in_RDI >> 0x20));
    get_bits((jpeg_decoder *)this_00,(int)((ulong)in_RDI >> 0x20));
    local_10 = local_10 + 1;
    if (1000 < local_10) {
      stop_decoding(in_RDI,in_stack_ffffffffffffffcc);
    }
  }
  stop_decoding(in_RDI,in_stack_ffffffffffffffcc);
}

Assistant:

void jpeg_decoder::init_progressive()
	{
		int i;

		if (m_comps_in_frame == 4)
			stop_decoding(JPGD_UNSUPPORTED_COLORSPACE);

		// Allocate the coefficient buffers.
		for (i = 0; i < m_comps_in_frame; i++)
		{
			m_dc_coeffs[i] = coeff_buf_open(m_max_mcus_per_row * m_comp_h_samp[i], m_max_mcus_per_col * m_comp_v_samp[i], 1, 1);
			m_ac_coeffs[i] = coeff_buf_open(m_max_mcus_per_row * m_comp_h_samp[i], m_max_mcus_per_col * m_comp_v_samp[i], 8, 8);
		}

		// See https://libjpeg-turbo.org/pmwiki/uploads/About/TwoIssueswiththeJPEGStandard.pdf
		uint32_t total_scans = 0;
		const uint32_t MAX_SCANS_TO_PROCESS = 1000;

		for (; ; )
		{
			int dc_only_scan, refinement_scan;
			pDecode_block_func decode_block_func;

			if (!init_scan())
				break;

			dc_only_scan = (m_spectral_start == 0);
			refinement_scan = (m_successive_high != 0);

			if ((m_spectral_start > m_spectral_end) || (m_spectral_end > 63))
				stop_decoding(JPGD_BAD_SOS_SPECTRAL);

			if (dc_only_scan)
			{
				if (m_spectral_end)
					stop_decoding(JPGD_BAD_SOS_SPECTRAL);
			}
			else if (m_comps_in_scan != 1)  /* AC scans can only contain one component */
				stop_decoding(JPGD_BAD_SOS_SPECTRAL);

			if ((refinement_scan) && (m_successive_low != m_successive_high - 1))
				stop_decoding(JPGD_BAD_SOS_SUCCESSIVE);

			if (dc_only_scan)
			{
				if (refinement_scan)
					decode_block_func = decode_block_dc_refine;
				else
					decode_block_func = decode_block_dc_first;
			}
			else
			{
				if (refinement_scan)
					decode_block_func = decode_block_ac_refine;
				else
					decode_block_func = decode_block_ac_first;
			}

			decode_scan(decode_block_func);

			m_bits_left = 16;
			get_bits(16);
			get_bits(16);

			total_scans++;
			if (total_scans > MAX_SCANS_TO_PROCESS)
				stop_decoding(JPGD_TOO_MANY_SCANS);
		}

		m_comps_in_scan = m_comps_in_frame;

		for (i = 0; i < m_comps_in_frame; i++)
			m_comp_list[i] = i;

		if (!calc_mcu_block_order())
			stop_decoding(JPGD_DECODE_ERROR);
	}